

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::edit(QAbstractItemView *this,QModelIndex *index)

{
  char cVar1;
  
  if (((index->r < 0) || (index->c < 0)) ||
     ((index->m).ptr != *(QAbstractItemModel **)(*(long *)(this + 8) + 0x2f8))) {
    edit();
  }
  cVar1 = (**(code **)(*(long *)this + 0x2e0))(this,index,0x1f,0);
  if (cVar1 == '\0') {
    edit();
  }
  return;
}

Assistant:

void QAbstractItemView::edit(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(!d->isIndexValid(index)))
        qWarning("edit: index was invalid");
    if (Q_UNLIKELY(!edit(index, AllEditTriggers, nullptr)))
        qWarning("edit: editing failed");
}